

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O0

double __thiscall MetaSim::BaseStat::getVariance(BaseStat *this)

{
  undefined8 uVar1;
  Exc *this_00;
  long lVar2;
  long in_RDI;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar3;
  undefined1 auVar4 [16];
  double mu;
  double sum;
  string *in_stack_fffffffffffffde8;
  V in_stack_fffffffffffffdf0;
  allocator *c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffdf8;
  allocator *s;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe00;
  V local_1a8;
  double *local_1a0;
  double *local_198;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [38];
  undefined1 local_112;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [16];
  BaseStat *in_stack_ffffffffffffff50;
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  double local_18;
  double local_10;
  
  local_10 = 0.0;
  if ((_endOfSim & 1) == 0) {
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"Can\'t get statistics before end of simulation\n",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"BaseStat",&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"basestat.hpp",&local_99);
    Exc::Exc((Exc *)in_stack_fffffffffffffe00._M_current,
             (string *)in_stack_fffffffffffffdf8._M_current,(string *)in_stack_fffffffffffffdf0._mu,
             in_stack_fffffffffffffde8);
    __cxa_throw(uVar1,&Exc::typeinfo,Exc::~Exc);
  }
  if ((_initFlag & 1) == 0) {
    local_112 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Statistics not initialized",&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"BaseStat",&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"basestat.hpp",&local_111);
    Exc::Exc((Exc *)in_stack_fffffffffffffe00._M_current,
             (string *)in_stack_fffffffffffffdf8._M_current,(string *)in_stack_fffffffffffffdf0._mu,
             in_stack_fffffffffffffde8);
    local_112 = 0;
    __cxa_throw(uVar1,&Exc::typeinfo,Exc::~Exc);
  }
  if (_expNum < 3) {
    local_18a = 1;
    this_00 = (Exc *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Need at least 3 run to evaluate statistic",&local_139);
    s = &local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"BaseStat",s);
    c = &local_189;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"basestat.hpp",c);
    Exc::Exc(this_00,(string *)s,(string *)c,in_stack_fffffffffffffde8);
    local_18a = 0;
    __cxa_throw(this_00,&Exc::typeinfo,Exc::~Exc);
  }
  local_18 = getMean(in_stack_ffffffffffffff50);
  this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x30);
  local_198 = (double *)std::vector<double,_std::allocator<double>_>::begin(this_01);
  local_1a0 = (double *)std::vector<double,_std::allocator<double>_>::end(this_01);
  anon_unknown_6::V::V(&local_1a8,local_18);
  local_10 = std::
             accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,MetaSim::(anonymous_namespace)::V>
                       (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(double)this_01,
                        in_stack_fffffffffffffdf0);
  lVar2 = (_expNum - 1) * _expNum;
  auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar4._0_8_ = lVar2;
  auVar4._12_4_ = 0x45300000;
  dVar3 = sqrt(local_10 /
               ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)));
  return dVar3;
}

Assistant:

double BaseStat::getVariance()
    {
        double sum = 0;
        double mu;		// the mean
  
        if (!_endOfSim) throw Exc(GET);
        if (!_initFlag) throw Exc(NO_INIT);
        if (_expNum < 3) throw Exc(NEED_3);

        mu = getMean();

        sum = accumulate(_exper.begin(), _exper.end(), 0.0, V(mu));
        return sqrt(sum/((_expNum - 1) * _expNum));
    }